

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O1

char * alenumString(ALCenum x)

{
  char *pcVar1;
  
  if (x < 0x1100) {
    switch(x) {
    case 0x1001:
      return "AL_CONE_INNER_ANGLE";
    case 0x1002:
      return "AL_CONE_OUTER_ANGLE";
    case 0x1003:
      return "AL_PITCH";
    case 0x1004:
      return "AL_POSITION";
    case 0x1005:
      return "AL_DIRECTION";
    case 0x1006:
      return "AL_VELOCITY";
    case 0x1007:
      return "AL_LOOPING";
    case 0x1008:
    case 0x100b:
    case 0x100c:
    case 0x1017:
    case 0x1018:
    case 0x1019:
    case 0x101a:
    case 0x101b:
    case 0x101c:
    case 0x101d:
    case 0x101e:
    case 0x101f:
    case 0x102a:
    case 0x102b:
    case 0x102c:
    case 0x102d:
    case 0x102e:
    case 0x102f:
      break;
    case 0x1009:
      return "AL_BUFFER";
    case 0x100a:
      return "AL_GAIN";
    case 0x100d:
      return "AL_MIN_GAIN";
    case 0x100e:
      return "AL_MAX_GAIN";
    case 0x100f:
      return "AL_ORIENTATION";
    case 0x1010:
      return "AL_SOURCE_STATE";
    case 0x1011:
      return "AL_INITIAL";
    case 0x1012:
      return "AL_PLAYING";
    case 0x1013:
      return "AL_PAUSED";
    case 0x1014:
      return "AL_STOPPED";
    case 0x1015:
      return "AL_BUFFERS_QUEUED";
    case 0x1016:
      return "AL_BUFFERS_PROCESSED";
    case 0x1020:
      return "AL_REFERENCE_DISTANCE";
    case 0x1021:
      return "AL_ROLLOFF_FACTOR";
    case 0x1022:
      return "AL_CONE_OUTER_GAIN";
    case 0x1023:
      return "AL_MAX_DISTANCE";
    case 0x1024:
      return "AL_SEC_OFFSET";
    case 0x1025:
      return "AL_SAMPLE_OFFSET";
    case 0x1026:
      return "AL_BYTE_OFFSET";
    case 0x1027:
      return "AL_SOURCE_TYPE";
    case 0x1028:
      return "AL_STATIC";
    case 0x1029:
      return "AL_STREAMING";
    case 0x1030:
      return "AL_UNDETERMINED";
    default:
      if (x == 0) {
        return "AL_NONE";
      }
      if (x == 0x202) {
        return "AL_SOURCE_RELATIVE";
      }
    }
  }
  else if (x < 0xb001) {
    if (x < 0x2010) {
      switch(x) {
      case 0x1100:
        return "AL_FORMAT_MONO8";
      case 0x1101:
        return "AL_FORMAT_MONO16";
      case 0x1102:
        return "AL_FORMAT_STEREO8";
      case 0x1103:
        return "AL_FORMAT_STEREO16";
      default:
        switch(x) {
        case 0x2001:
          return "AL_FREQUENCY";
        case 0x2002:
          return "AL_BITS";
        case 0x2003:
          return "AL_CHANNELS";
        case 0x2004:
          return "AL_SIZE";
        }
      }
    }
    else if (x < 0xa001) {
      if (x == 0x2010) {
        return "AL_UNUSED";
      }
      if (x == 0x2011) {
        return "AL_PENDING";
      }
      if (x == 0x2012) {
        return "AL_PROCESSED";
      }
    }
    else {
      switch(x) {
      case 0xa001:
        return "AL_INVALID_NAME";
      case 0xa002:
        return "AL_INVALID_ENUM";
      case 0xa003:
        return "AL_INVALID_VALUE";
      case 0xa004:
        return "AL_INVALID_OPERATION";
      case 0xa005:
        return "AL_OUT_OF_MEMORY";
      }
    }
  }
  else if (x < 0xd000) {
    if (x < 0xc000) {
      switch(x) {
      case 0xb001:
        return "AL_VENDOR";
      case 0xb002:
        return "AL_VERSION";
      case 0xb003:
        return "AL_RENDERER";
      case 0xb004:
        return "AL_EXTENSIONS";
      }
    }
    else {
      if (x == 0xc000) {
        return "AL_DOPPLER_FACTOR";
      }
      if (x == 0xc001) {
        return "AL_DOPPLER_VELOCITY";
      }
      if (x == 0xc003) {
        return "AL_SPEED_OF_SOUND";
      }
    }
  }
  else {
    switch(x) {
    case 0xd000:
      return "AL_DISTANCE_MODEL";
    case 0xd001:
      return "AL_INVERSE_DISTANCE";
    case 0xd002:
      return "AL_INVERSE_DISTANCE_CLAMPED";
    case 0xd003:
      return "AL_LINEAR_DISTANCE";
    case 0xd004:
      return "AL_LINEAR_DISTANCE_CLAMPED";
    case 0xd005:
      return "AL_EXPONENT_DISTANCE";
    case 0xd006:
      return "AL_EXPONENT_DISTANCE_CLAMPED";
    }
    if (x == 0x10010) {
      return "AL_FORMAT_MONO_FLOAT32";
    }
    if (x == 0x10011) {
      return "AL_FORMAT_STEREO_FLOAT32";
    }
  }
  pcVar1 = sprintf_alloc("0x%X");
  return pcVar1;
}

Assistant:

const char *alenumString(const ALCenum x)
{
    switch (x) {
        #define ENUM_TEST(e) case e: return #e
        ENUM_TEST(AL_NONE);
        ENUM_TEST(AL_SOURCE_RELATIVE);
        ENUM_TEST(AL_CONE_INNER_ANGLE);
        ENUM_TEST(AL_CONE_OUTER_ANGLE);
        ENUM_TEST(AL_PITCH);
        ENUM_TEST(AL_POSITION);
        ENUM_TEST(AL_DIRECTION);
        ENUM_TEST(AL_VELOCITY);
        ENUM_TEST(AL_LOOPING);
        ENUM_TEST(AL_BUFFER);
        ENUM_TEST(AL_GAIN);
        ENUM_TEST(AL_MIN_GAIN);
        ENUM_TEST(AL_MAX_GAIN);
        ENUM_TEST(AL_ORIENTATION);
        ENUM_TEST(AL_SOURCE_STATE);
        ENUM_TEST(AL_INITIAL);
        ENUM_TEST(AL_PLAYING);
        ENUM_TEST(AL_PAUSED);
        ENUM_TEST(AL_STOPPED);
        ENUM_TEST(AL_BUFFERS_QUEUED);
        ENUM_TEST(AL_BUFFERS_PROCESSED);
        ENUM_TEST(AL_REFERENCE_DISTANCE);
        ENUM_TEST(AL_ROLLOFF_FACTOR);
        ENUM_TEST(AL_CONE_OUTER_GAIN);
        ENUM_TEST(AL_MAX_DISTANCE);
        ENUM_TEST(AL_SEC_OFFSET);
        ENUM_TEST(AL_SAMPLE_OFFSET);
        ENUM_TEST(AL_BYTE_OFFSET);
        ENUM_TEST(AL_SOURCE_TYPE);
        ENUM_TEST(AL_STATIC);
        ENUM_TEST(AL_STREAMING);
        ENUM_TEST(AL_UNDETERMINED);
        ENUM_TEST(AL_FORMAT_MONO8);
        ENUM_TEST(AL_FORMAT_MONO16);
        ENUM_TEST(AL_FORMAT_STEREO8);
        ENUM_TEST(AL_FORMAT_STEREO16);
        ENUM_TEST(AL_FREQUENCY);
        ENUM_TEST(AL_BITS);
        ENUM_TEST(AL_CHANNELS);
        ENUM_TEST(AL_SIZE);
        ENUM_TEST(AL_UNUSED);
        ENUM_TEST(AL_PENDING);
        ENUM_TEST(AL_PROCESSED);
        ENUM_TEST(AL_INVALID_NAME);
        ENUM_TEST(AL_INVALID_ENUM);
        ENUM_TEST(AL_INVALID_VALUE);
        ENUM_TEST(AL_INVALID_OPERATION);
        ENUM_TEST(AL_OUT_OF_MEMORY);
        ENUM_TEST(AL_VENDOR);
        ENUM_TEST(AL_VERSION);
        ENUM_TEST(AL_RENDERER);
        ENUM_TEST(AL_EXTENSIONS);
        ENUM_TEST(AL_DOPPLER_FACTOR);
        ENUM_TEST(AL_DOPPLER_VELOCITY);
        ENUM_TEST(AL_SPEED_OF_SOUND);
        ENUM_TEST(AL_DISTANCE_MODEL);
        ENUM_TEST(AL_INVERSE_DISTANCE);
        ENUM_TEST(AL_INVERSE_DISTANCE_CLAMPED);
        ENUM_TEST(AL_LINEAR_DISTANCE);
        ENUM_TEST(AL_LINEAR_DISTANCE_CLAMPED);
        ENUM_TEST(AL_EXPONENT_DISTANCE);
        ENUM_TEST(AL_EXPONENT_DISTANCE_CLAMPED);
        ENUM_TEST(AL_FORMAT_MONO_FLOAT32);
        ENUM_TEST(AL_FORMAT_STEREO_FLOAT32);
        #undef ENUM_TEST
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}